

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O0

void Saig_ManCexMinCollectFrameTerms_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Int_t *vFrameCisOne)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Int_t *vFrameCisOne_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(pAig,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(pAig,pObj);
    iVar1 = Aig_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCi(pObj);
        if (iVar1 != 0) {
          iVar1 = Aig_ObjId(pObj);
          Vec_IntPush(vFrameCisOne,iVar1);
        }
      }
      else {
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManCexMinCollectFrameTerms_rec(pAig,pAVar2,vFrameCisOne);
        pAVar2 = Aig_ObjFanin1(pObj);
        Saig_ManCexMinCollectFrameTerms_rec(pAig,pAVar2,vFrameCisOne);
      }
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      Saig_ManCexMinCollectFrameTerms_rec(pAig,pAVar2,vFrameCisOne);
    }
  }
  return;
}

Assistant:

void Saig_ManCexMinCollectFrameTerms_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Int_t * vFrameCisOne )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
    else if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin0(pObj), vFrameCisOne );
        Saig_ManCexMinCollectFrameTerms_rec( pAig, Aig_ObjFanin1(pObj), vFrameCisOne );
    }
    else if ( Aig_ObjIsCi(pObj) )
        Vec_IntPush( vFrameCisOne, Aig_ObjId(pObj) );
}